

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OverviewExamples.cpp
# Opt level: O1

Sandwich * createSandwichForTest(void)

{
  Sandwich *in_RDI;
  long *plVar1;
  long lVar2;
  undefined1 *local_90 [2];
  undefined1 local_80 [16];
  undefined1 *local_70 [2];
  undefined1 local_60 [16];
  long *local_50 [2];
  long local_40 [2];
  
  (in_RDI->bread)._M_dataplus._M_p = (pointer)&(in_RDI->bread).field_2;
  (in_RDI->bread)._M_string_length = 0;
  (in_RDI->bread).field_2._M_local_buf[0] = '\0';
  (in_RDI->condiments).contents.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (in_RDI->condiments).contents.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (in_RDI->condiments).contents.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (in_RDI->fillings).contents.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (in_RDI->fillings).contents.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (in_RDI->fillings).contents.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::__cxx11::string::_M_replace((ulong)in_RDI,0,(char *)0x0,0x198644);
  local_90[0] = local_80;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_90,"Mayo","");
  local_70[0] = local_60;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_70,"Pepper","");
  plVar1 = local_40;
  local_50[0] = plVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_50,"Olive Oil","");
  std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
  _M_assign_aux<std::__cxx11::string_const*>
            ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
             &in_RDI->condiments,local_90,&stack0xffffffffffffffd0);
  lVar2 = -0x60;
  do {
    if (plVar1 != (long *)plVar1[-2]) {
      operator_delete((long *)plVar1[-2],*plVar1 + 1);
    }
    plVar1 = plVar1 + -4;
    lVar2 = lVar2 + 0x20;
  } while (lVar2 != 0);
  local_90[0] = local_80;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_90,"Tomato","");
  local_70[0] = local_60;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_70,"Lettuce","");
  plVar1 = local_40;
  local_50[0] = plVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_50,"Cheddar","");
  std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
  _M_assign_aux<std::__cxx11::string_const*>
            ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&in_RDI->fillings,
             local_90,&stack0xffffffffffffffd0);
  lVar2 = -0x60;
  do {
    if (plVar1 != (long *)plVar1[-2]) {
      operator_delete((long *)plVar1[-2],*plVar1 + 1);
    }
    plVar1 = plVar1 + -4;
    lVar2 = lVar2 + 0x20;
  } while (lVar2 != 0);
  return in_RDI;
}

Assistant:

static Sandwich createSandwichForTest()
{
    Sandwich result;
    result.bread = "Sourdough";
    result.condiments.contents = {"Mayo", "Pepper", "Olive Oil"};
    result.fillings.contents = {"Tomato", "Lettuce", "Cheddar"};
    return result;
}